

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap.h
# Opt level: O2

char * f2cstrv2(char *fstr,char *cstr,int felem_len,int celem_len,int nelem)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  
  if (nelem != 0) {
    iVar6 = 0;
    iVar7 = 0;
    if (0 < felem_len) {
      iVar7 = felem_len;
    }
    iVar5 = 0;
    if (0 < nelem) {
      iVar5 = nelem;
    }
    for (; iVar4 = iVar7, iVar6 != iVar5; iVar6 = iVar6 + 1) {
      while (iVar4 != 0) {
        cVar3 = *fstr;
        fstr = fstr + 1;
        *cstr = cVar3;
        cstr = cstr + 1;
        iVar4 = iVar4 + -1;
      }
      *cstr = '\0';
      pcVar9 = cstr;
      if (felem_len == 0) {
LAB_0015f8d2:
        *pcVar9 = '\0';
      }
      else if (0 < felem_len) {
        lVar8 = 1;
        do {
          if (pcVar9 <= cstr + -(long)felem_len) goto LAB_0015f8cf;
          pcVar1 = pcVar9 + -1;
          pcVar2 = pcVar9 + -1;
          lVar8 = 0;
          pcVar9 = pcVar1;
        } while (*pcVar2 == ' ');
        lVar8 = 1;
LAB_0015f8cf:
        pcVar9 = pcVar9 + lVar8;
        goto LAB_0015f8d2;
      }
      cstr = cstr + (celem_len - felem_len);
    }
  }
  return cstr + -(long)(nelem * celem_len);
}

Assistant:

static char *f2cstrv2(char *fstr, char* cstr, int felem_len, int celem_len,
               int nelem)
{
   int i,j;

   if( nelem )
      for (i=0; i<nelem; i++, cstr+=(celem_len-felem_len)) {
	 for (j=0; j<felem_len; j++) *cstr++ = *fstr++;
	 *cstr='\0';
	 kill_trailingn( cstr-felem_len, ' ', cstr );
      }
   return( cstr-celem_len*nelem );
}